

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

VarValue *
deqp::gles31::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  bool bVar1;
  uint uVar2;
  deUint32 dVar3;
  DataType dataType;
  DataType DVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  uVar2 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    uVar6 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = 0;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      fVar8 = deRandom_getFloat(&rnd->m_rnd);
      *(float *)((long)&__return_storage_ptr__->val + uVar6 * 4) = fVar8 * 20.0 + -10.0;
    }
  }
  else if (type - TYPE_INT < 4) {
    uVar6 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      dVar3 = deRandom_getUint32(&rnd->m_rnd);
      *(uint *)((long)&__return_storage_ptr__->val + uVar6 * 4) = dVar3 % 0x15 - 10;
    }
  }
  else if (type - TYPE_UINT < 4) {
    uVar6 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      dVar3 = deRandom_getUint32(&rnd->m_rnd);
      *(uint *)((long)&__return_storage_ptr__->val + uVar6 * 4) = dVar3 % 0xb;
    }
  }
  else if (type - TYPE_BOOL < 4) {
    uVar6 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = 0;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      bVar1 = de::Random::getBool(rnd);
      (__return_storage_ptr__->val).boolV[uVar6] = bVar1;
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    dataType = getSamplerLookupReturnType(type);
    DVar4 = glu::getDataTypeScalarType(dataType);
    uVar2 = glu::getDataTypeScalarSize(dataType);
    uVar6 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
    for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      if (DVar4 == TYPE_UINT) {
        dVar3 = deRandom_getUint32(&rnd->m_rnd);
        uVar5 = dVar3 % 0xb;
LAB_004ec851:
        *(uint *)((long)&__return_storage_ptr__->val + uVar6 * 4 + 4) = uVar5;
      }
      else {
        if (DVar4 == TYPE_INT) {
          dVar3 = deRandom_getUint32(&rnd->m_rnd);
          uVar5 = dVar3 % 0x15 - 10;
          goto LAB_004ec851;
        }
        if (DVar4 == TYPE_FLOAT) {
          fVar8 = deRandom_getFloat(&rnd->m_rnd);
          *(float *)((long)&__return_storage_ptr__->val + uVar6 * 4 + 4) = fVar8 + 0.0;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeUintOrUVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.uintV[i] = (deUint32)rnd.getInt(0, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		const glu::DataType		texResultType		= getSamplerLookupReturnType(type);
		const glu::DataType		texResultScalarType	= glu::getDataTypeScalarType(texResultType);
		const int				texResultNumDims	= glu::getDataTypeScalarSize(texResultType);

		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < texResultNumDims; i++)
		{
			switch (texResultScalarType)
			{
				case glu::TYPE_FLOAT:	result.val.samplerV.fillColor.floatV[i]		= rnd.getFloat(0.0f, 1.0f);		break;
				case glu::TYPE_INT:		result.val.samplerV.fillColor.intV[i]		= rnd.getInt(-10, 10);			break;
				case glu::TYPE_UINT:	result.val.samplerV.fillColor.uintV[i]		= (deUint32)rnd.getInt(0, 10);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
	else
		DE_ASSERT(false);

	return result;
}